

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O1

void perf_get_descriptor(_func_void_integral_image_ptr_interest_point_ptr_float_ptr *function,
                        integral_image *iimage,interest_point *ipoint,float *GW,benchmark_data *data
                        )

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  double *pdVar4;
  double *pdVar5;
  benchmark_data *pbVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_ZMM2 [64];
  double cycles;
  vector<double,_std::allocator<double>_> cycleslist;
  long local_78;
  double local_70;
  double *local_68;
  double *pdStack_60;
  double *local_58;
  double local_50;
  long local_48;
  benchmark_data *local_40;
  double local_38;
  
  local_70 = 0.0;
  local_78 = 100;
  dVar11 = 1.0;
  local_40 = data;
  do {
    local_78 = (long)(dVar11 * (double)local_78);
    cpuid_basic_info(0);
    uVar1 = rdtsc();
    for (lVar7 = local_78; lVar7 != 0; lVar7 = lVar7 + -1) {
      (*function)(iimage,ipoint,GW);
    }
    uVar2 = rdtsc();
    cpuid_basic_info(0);
    auVar9 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                (((ulong)(uint)-(int)(uVar1 >> 0x20) << 0x20) - (uVar1 & 0xffffffff)
                                ) + (uVar2 & 0xffffffff) + (uVar2 & 0xffffffff00000000));
    local_70 = auVar9._0_8_;
    dVar11 = 100000000.0 / local_70;
  } while (2.0 < dVar11);
  local_68 = (double *)0x0;
  pdStack_60 = (double *)0x0;
  local_58 = (double *)0x0;
  local_38 = (double)local_78;
  local_50 = 0.0;
  lVar7 = 0;
  do {
    cpuid_basic_info(0);
    uVar1 = rdtsc();
    local_48 = lVar7;
    for (lVar8 = local_78; lVar8 != 0; lVar8 = lVar8 + -1) {
      (*function)(iimage,ipoint,GW);
    }
    uVar2 = rdtsc();
    cpuid_basic_info(0);
    auVar9 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                (((ulong)(uint)-(int)(uVar1 >> 0x20) << 0x20) - (uVar1 & 0xffffffff)
                                ) + (uVar2 & 0xffffffff) + (uVar2 & 0xffffffff00000000));
    dVar11 = auVar9._0_8_ / local_38;
    local_70 = dVar11;
    if (pdStack_60 == local_58) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_68,(iterator)pdStack_60,&local_70);
    }
    else {
      *pdStack_60 = dVar11;
      pdStack_60 = pdStack_60 + 1;
    }
    pbVar6 = local_40;
    pdVar5 = pdStack_60;
    pdVar4 = local_68;
    local_50 = local_50 + dVar11;
    lVar7 = local_48 + 1;
  } while (lVar7 != 10);
  dVar11 = local_50 / 10.0;
  lVar7 = local_40->num_flops;
  local_70 = dVar11;
  if (local_68 != pdStack_60) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_68,pdStack_60,(int)LZCOUNT((long)pdStack_60 - (long)local_68 >> 3) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar4,pdVar5);
  }
  auVar12._0_8_ = ((double)lVar7 * 100.0) / dVar11;
  auVar12._8_8_ = 0;
  auVar15._8_8_ = 0x3fdfffffffffffff;
  auVar15._0_8_ = 0x3fdfffffffffffff;
  auVar3._8_8_ = 0x8000000000000000;
  auVar3._0_8_ = 0x8000000000000000;
  auVar9 = vpternlogq_avx512vl(auVar15,auVar12,auVar3,0xf8);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = auVar12._0_8_ + auVar9._0_8_;
  auVar3 = vroundsd_avx(auVar13,auVar13,0xb);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_70;
  auVar9 = vmovhps_avx(auVar14,*local_68);
  auVar10 = vcvttpd2uqq_avx512vl(auVar9);
  auVar9._0_8_ = pbVar6->avg_cycles;
  auVar9._8_8_ = pbVar6->min_cycles;
  auVar9 = vpaddq_avx(auVar10,auVar9);
  pbVar6->avg_cycles = auVar9._0_8_;
  pbVar6->min_cycles = auVar9._8_8_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = pdStack_60[-1];
  lVar7 = vcvttsd2usi_avx512f(auVar10);
  pbVar6->max_cycles = pbVar6->max_cycles + lVar7;
  pbVar6->flops_per_cycle = auVar3._0_8_ / 100.0 + pbVar6->flops_per_cycle;
  operator_delete(local_68,(long)local_58 - (long)local_68);
  return;
}

Assistant:

void perf_get_descriptor(void (*function)(struct integral_image *, struct interest_point *, float *),
                         struct integral_image *iimage, struct interest_point *ipoint, float *GW,
                         struct benchmark_data &data) {
    double cycles = 0.;
    long num_runs = 100;
    double multiplier = 1;
    uint64_t start, end;

#ifdef WARM_UP
    // Warm-up phase: we determine a number of executions that allows
    // the code to be executed for at least CYCLES_REQUIRED cycles.
    // This helps excluding timing overhead when measuring small runtimes.
    do {
        num_runs = num_runs * multiplier;
        start = start_tsc();
        for (size_t i = 0; i < num_runs; i++) {
            (*function)(iimage, ipoint, GW);
        }
        end = stop_tsc(start);

        cycles = (double)end;
        multiplier = (CYCLES_REQUIRED) / (cycles);

    } while (multiplier > 2);
#endif

    std::vector<double> cycleslist;

    // Actual performance measurements repeated REP times.
    // We simply store all results and compute medians during post-processing.
    double total_cycles = 0;
    for (size_t j = 0; j < REP; j++) {
        start = start_tsc();
        for (size_t i = 0; i < num_runs; ++i) {
            (*function)(iimage, ipoint, GW);
        }
        end = stop_tsc(start);

        cycles = ((double)end) / num_runs;
        total_cycles += cycles;

        cycleslist.push_back(cycles);
    }
    total_cycles /= REP;

    cycles = total_cycles;  // cyclesList.front();
    double flops_per_cycle = round((100.0 * data.num_flops) / cycles) / 100.0;
    std::sort(cycleslist.begin(), cycleslist.end());
    data.avg_cycles += (uint64_t)cycles;
    data.min_cycles += (uint64_t)cycleslist.front();
    data.max_cycles += (uint64_t)cycleslist.back();
    data.flops_per_cycle += flops_per_cycle;
}